

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextElementTable.h
# Opt level: O1

ImaginaryIntegerConstant * __thiscall
psy::TextElementTable<psy::C::ImaginaryIntegerConstant>::findOrInsert
          (TextElementTable<psy::C::ImaginaryIntegerConstant> *this,char *chars,uint size)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ImaginaryIntegerConstant *this_00;
  ImaginaryIntegerConstant **ppIVar4;
  int iVar5;
  
  this_00 = find(this,chars,size);
  if (this_00 == (ImaginaryIntegerConstant *)0x0) {
    iVar1 = this->allocated_;
    iVar5 = this->count_ + 1;
    this->count_ = iVar5;
    if (iVar5 == iVar1) {
      iVar5 = 4;
      if (iVar1 != 0) {
        iVar5 = iVar1 * 2;
      }
      this->allocated_ = iVar5;
      ppIVar4 = (ImaginaryIntegerConstant **)realloc(this->elements_,(long)iVar5 << 3);
      this->elements_ = ppIVar4;
    }
    this_00 = (ImaginaryIntegerConstant *)operator_new(0x30);
    C::ImaginaryIntegerConstant::ImaginaryIntegerConstant(this_00,chars,size);
    iVar1 = this->count_;
    this->elements_[iVar1] = this_00;
    ppIVar4 = this->buckets_;
    if ((ppIVar4 == (ImaginaryIntegerConstant **)0x0) ||
       (iVar1 = iVar1 * 5, uVar2 = this->bucketCount_,
       SBORROW4(iVar1,uVar2 * 3) == (int)(iVar1 + uVar2 * -3) < 0)) {
      rehash(this);
    }
    else {
      uVar3 = (ulong)*(uint *)&(this_00->super_Lexeme).field_0x18 % (ulong)uVar2;
      *(ImaginaryIntegerConstant **)&(this_00->super_Lexeme).field_0x20 = ppIVar4[uVar3];
      ppIVar4[uVar3] = this_00;
    }
  }
  return this_00;
}

Assistant:

const ElemT* findOrInsert(const char *chars, unsigned int size)
    {
        ElemT* elem = const_cast<ElemT*>(find(chars, size));
        if (elem)
            return elem;

        if (++count_ == allocated_) {
            if (!allocated_)
                allocated_ = 4;
            else
                allocated_ <<= 1;
            elements_ = (ElemT**) std::realloc(elements_, sizeof(ElemT*)* allocated_);
        }

        elem = new ElemT(chars, size);
        elements_[count_] = elem;

        if (!buckets_ || count_ * 5 >= bucketCount_ * 3)
            rehash();
        else {
            unsigned h = elem->hashCode() % bucketCount_;
            elem ->next_ = buckets_[h];
            buckets_[h] = elem;
        }

        return elem;
    }